

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O2

NodeRecord * __thiscall
embree::sse2::CreateMortonLeaf<4,_embree::Object>::operator()
          (NodeRecord *__return_storage_ptr__,CreateMortonLeaf<4,_embree::Object> *this,
          range<unsigned_int> *current,CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  uint uVar2;
  uint uVar3;
  FastAllocator *this_00;
  ThreadLocal *pTVar4;
  ThreadLocal2 *this_01;
  UserGeometry *pUVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar13;
  ulong local_b8;
  Lock<embree::MutexSys> local_b0;
  BBox3fa *local_a0;
  BBox3fa box;
  ThreadLocal2 *local_60;
  undefined1 local_58 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_48;
  
  uVar2 = current->_begin;
  uVar7 = (ulong)(current->_end - uVar2);
  local_b8 = uVar7 * 8;
  this_00 = alloc->alloc;
  pTVar4 = alloc->talloc1;
  this_01 = pTVar4->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_b0.locked = true;
    local_b0.mutex = &this_01->mutex;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    box.lower.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    box.lower.field_0._8_1_ = 1;
    local_60 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,&local_60);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&box);
    Lock<embree::MutexSys>::~Lock(&local_b0);
  }
  uVar10 = local_b8;
  pTVar4->bytesUsed = pTVar4->bytesUsed + local_b8;
  sVar8 = pTVar4->cur;
  uVar9 = (ulong)(-(int)sVar8 & 0xf);
  uVar11 = sVar8 + local_b8 + uVar9;
  pTVar4->cur = uVar11;
  if (pTVar4->end < uVar11) {
    pTVar4->cur = sVar8;
    uVar9 = pTVar4->allocBlockSize;
    if (local_b8 * 4 < uVar9 || local_b8 * 4 - uVar9 == 0) {
      box.lower.field_0._0_8_ = uVar9;
      pcVar12 = (char *)FastAllocator::malloc(this_00,(size_t)&box);
      pTVar4->ptr = pcVar12;
      sVar8 = (pTVar4->end - pTVar4->cur) + pTVar4->bytesWasted;
      pTVar4->bytesWasted = sVar8;
      pTVar4->end = box.lower.field_0._0_8_;
      pTVar4->cur = uVar10;
      if ((ulong)box.lower.field_0._0_8_ < uVar10) {
        pTVar4->cur = 0;
        box.lower.field_0._0_8_ = pTVar4->allocBlockSize;
        pcVar12 = (char *)FastAllocator::malloc(this_00,(size_t)&box);
        pTVar4->ptr = pcVar12;
        sVar8 = (pTVar4->end - pTVar4->cur) + pTVar4->bytesWasted;
        pTVar4->bytesWasted = sVar8;
        pTVar4->end = box.lower.field_0._0_8_;
        pTVar4->cur = uVar10;
        if ((ulong)box.lower.field_0._0_8_ < uVar10) {
          pTVar4->cur = 0;
          pcVar12 = (char *)0x0;
          goto LAB_0045fe61;
        }
      }
      pTVar4->bytesWasted = sVar8;
    }
    else {
      pcVar12 = (char *)FastAllocator::malloc(this_00,(size_t)&local_b8);
    }
  }
  else {
    pTVar4->bytesWasted = pTVar4->bytesWasted + uVar9;
    pcVar12 = pTVar4->ptr + (uVar11 - local_b8);
  }
LAB_0045fe61:
  pUVar5 = this->mesh;
  local_48 = _DAT_01f45a40;
  local_58 = _DAT_01f45a30;
  for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
    uVar3 = this->morton[uVar2 + uVar10].field_0.field_0.index;
    local_b0.mutex = (MutexSys *)(pUVar5->super_AccelSet).super_Geometry.userPtr;
    local_b0._12_4_ = 0;
    local_a0 = &box;
    local_b0._8_4_ = uVar3;
    (**(code **)&(pUVar5->super_AccelSet).super_Geometry.field_0x58)(&local_b0);
    auVar6[8] = box.lower.field_0._8_1_;
    auVar6._0_8_ = box.lower.field_0._0_8_;
    auVar6._9_7_ = box.lower.field_0._9_7_;
    local_58 = minps(local_58,auVar6);
    local_48.m128 = (__m128)maxps(local_48.m128,(undefined1  [16])box.upper.field_0);
    *(uint *)(pcVar12 + uVar10 * 8) = this->geomID_;
    *(uint *)(pcVar12 + uVar10 * 8 + 4) = uVar3;
  }
  uVar10 = 7;
  if (uVar7 < 7) {
    uVar10 = uVar7;
  }
  aVar13._0_12_ = local_58._0_12_;
  aVar13.m128[3] = (float)(current->_end - current->_begin);
  (__return_storage_ptr__->ref).ptr = uVar10 | (ulong)pcVar12 | 8;
  (__return_storage_ptr__->bounds).lower.field_0 = aVar13;
  (__return_storage_ptr__->bounds).upper.field_0 = local_48;
  return __return_storage_ptr__;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        
        /* allocate leaf node */
        Object* accel = (Object*) alloc.malloc1(items*sizeof(Object),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,items);
        const UserGeometry* mesh = this->mesh;
        
        BBox3fa bounds = empty;
        for (size_t i=0; i<items; i++)
        {
          const unsigned int index = morton[start+i].index;
          const unsigned int primID = index; 
          bounds.extend(mesh->bounds(primID));
          new (&accel[i]) Object(geomID_,primID);
        }

        BBox3fx box_o = (BBox3fx&)bounds;
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }